

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

word Abc_Tt6Stretch(word t,int nVars)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  
  uVar3 = (uint)t;
  if (nVars < 0) {
    __assert_fail("nVars >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                  ,0x489,"word Abc_Tt6Stretch(word, int)");
  }
  uVar2 = -(uVar3 & 1);
  if (nVars != 0) {
    uVar2 = uVar3;
  }
  uVar2 = (uVar2 & 3) * 5;
  if (1 < (uint)nVars) {
    uVar2 = uVar3;
  }
  uVar2 = (uVar2 & 0xf) * 0x11;
  iVar1 = 2;
  if (2U < (uint)nVars) {
    uVar2 = uVar3;
    iVar1 = nVars;
  }
  iVar4 = 3;
  if (2U < (uint)nVars) {
    iVar4 = iVar1;
  }
  uVar3 = (uVar2 & 0xff) * 0x101;
  if (iVar4 != 3) {
    uVar3 = uVar2;
  }
  uVar2 = (uVar3 & 0xffff) * 0x10001;
  if (1 < iVar4 - 3U) {
    uVar2 = uVar3;
  }
  return (ulong)uVar2 * 0x100000001;
}

Assistant:

static inline word Abc_Tt6Stretch( word t, int nVars )
{
    assert( nVars >= 0 );
    if ( nVars == 0 )
        nVars++, t = (t & 0x1) | ((t & 0x1) << 1);
    if ( nVars == 1 )
        nVars++, t = (t & 0x3) | ((t & 0x3) << 2);
    if ( nVars == 2 )
        nVars++, t = (t & 0xF) | ((t & 0xF) << 4);
    if ( nVars == 3 )
        nVars++, t = (t & 0xFF) | ((t & 0xFF) << 8);
    if ( nVars == 4 )
        nVars++, t = (t & 0xFFFF) | ((t & 0xFFFF) << 16);
    if ( nVars == 5 )
        nVars++, t = (t & 0xFFFFFFFF) | ((t & 0xFFFFFFFF) << 32);
    assert( nVars == 6 );
    return t;
}